

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

void __thiscall cmCryptoHash::cmCryptoHash(cmCryptoHash *this,Algo algo)

{
  rhash prVar1;
  Algo algo_local;
  cmCryptoHash *this_local;
  
  this->Id = cmCryptoHashAlgoToId[algo];
  prVar1 = cmCryptoHash_rhash_init(this->Id);
  this->CTX = prVar1;
  return;
}

Assistant:

cmCryptoHash::cmCryptoHash(Algo algo)
  : Id(cmCryptoHashAlgoToId[algo])
  , CTX(cmCryptoHash_rhash_init(Id))
{
}